

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O1

void __thiscall CJSON::ParseObject(CJSON *this,string *obj)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  undefined8 *puVar6;
  CJSONException *pCVar7;
  long *plVar8;
  uint uVar9;
  size_type *psVar10;
  int iVar11;
  undefined4 uVar12;
  char cVar13;
  string Ret;
  char *beg;
  char *end;
  string Key;
  string Value;
  string local_c0;
  byte *local_a0;
  byte *local_98;
  key_type local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar2 = false;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_a0 = (byte *)(obj->_M_dataplus)._M_p;
  local_98 = local_a0 + obj->_M_string_length;
  if (obj->_M_string_length != 0) {
    bVar2 = false;
    bVar3 = false;
    iVar4 = 0;
    do {
      bVar1 = *local_a0;
      uVar9 = (uint)bVar1;
      if (uVar9 < 0x22) {
        if (((1 < uVar9 - 9) && (1 < uVar9 - 0xc)) && (uVar9 != 0x20)) {
LAB_00129186:
          if (!bVar2) goto LAB_00129301;
          if (local_90._M_string_length != 0) {
            if (iVar4 == 0) {
              pCVar7 = (CJSONException *)__cxa_allocate_exception(0x30);
              std::operator+(&local_50,"Missing seperator after \'",&local_90);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_c0._M_dataplus._M_p = (pointer)*plVar8;
              psVar10 = (size_type *)(plVar8 + 2);
              if ((size_type *)local_c0._M_dataplus._M_p == psVar10) {
                local_c0.field_2._M_allocated_capacity = *psVar10;
                local_c0.field_2._8_8_ = plVar8[3];
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              }
              else {
                local_c0.field_2._M_allocated_capacity = *psVar10;
              }
              local_c0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar10;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              CJSONException::CJSONException(pCVar7,&local_c0,MISSING_SEPERATOR);
              __cxa_throw(pCVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
            }
            if (bVar1 == 0x74) {
LAB_001291ba:
              ParseBool_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
            }
            else if (bVar1 == 0x6e) {
              ParseNull_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
            }
            else {
              if (bVar1 == 0x66) goto LAB_001291ba;
              iVar4 = isalnum((int)(char)bVar1);
              if (((iVar4 == 0) && (bVar1 != 0x2d)) && (bVar1 != 0x2b)) {
                pCVar7 = (CJSONException *)__cxa_allocate_exception(0x30);
                std::operator+(&local_50,"Invalid type for key \'",&local_90);
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
                local_c0._M_dataplus._M_p = (pointer)*plVar8;
                psVar10 = (size_type *)(plVar8 + 2);
                if ((size_type *)local_c0._M_dataplus._M_p == psVar10) {
                  local_c0.field_2._M_allocated_capacity = *psVar10;
                  local_c0.field_2._8_8_ = plVar8[3];
                  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                }
                else {
                  local_c0.field_2._M_allocated_capacity = *psVar10;
                }
                local_c0._M_string_length = plVar8[1];
                *plVar8 = (long)psVar10;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                CJSONException::CJSONException(pCVar7,&local_c0,INVALID_TYPE);
                __cxa_throw(pCVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
              }
              ParseNum_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
            }
LAB_0012921c:
            std::__cxx11::string::operator=((string *)&local_70,(string *)&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00129248;
          }
LAB_00129308:
          uVar12 = 10;
          goto LAB_0012930d;
        }
      }
      else if (uVar9 < 0x5b) {
        if (uVar9 == 0x22) {
          if (!bVar2) goto LAB_00129301;
          if (bVar3) {
            pCVar7 = (CJSONException *)__cxa_allocate_exception(0x30);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"Missing seperator \',\'.","");
            CJSONException::CJSONException(pCVar7,&local_c0,MISSING_SEPERATOR);
            __cxa_throw(pCVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          if (local_90._M_string_length != 0) {
            if ((local_68 != 0) || (iVar4 == 0)) {
              pCVar7 = (CJSONException *)__cxa_allocate_exception(0x30);
              std::operator+(&local_50,"Missing seperator after \'",&local_90);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_c0._M_dataplus._M_p = (pointer)*plVar8;
              psVar10 = (size_type *)(plVar8 + 2);
              if ((size_type *)local_c0._M_dataplus._M_p == psVar10) {
                local_c0.field_2._M_allocated_capacity = *psVar10;
                local_c0.field_2._8_8_ = plVar8[3];
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              }
              else {
                local_c0.field_2._M_allocated_capacity = *psVar10;
              }
              local_c0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar10;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              CJSONException::CJSONException(pCVar7,&local_c0,MISSING_SEPERATOR);
              __cxa_throw(pCVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
            }
            ParseString_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
            goto LAB_0012921c;
          }
          ParseString_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        else if (uVar9 == 0x2c) {
          if (!bVar2) goto LAB_00129301;
          if (!bVar3) {
            pCVar7 = (CJSONException *)__cxa_allocate_exception(0x30);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Lonly \',\'","");
            CJSONException::CJSONException(pCVar7,&local_c0,WRONG_PLACED_SEPERATOR);
            __cxa_throw(pCVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          bVar3 = false;
        }
        else {
          if (uVar9 != 0x3a) goto LAB_00129186;
          if (!bVar2) goto LAB_00129301;
          iVar4 = 1;
          if (local_90._M_string_length == 0) goto LAB_00129308;
        }
      }
      else {
        if ((uVar9 != 0x5b) && (uVar9 != 0x7b)) {
          if (uVar9 != 0x7d) goto LAB_00129186;
          break;
        }
        if (!bVar2) {
          bVar2 = true;
          goto LAB_0012924b;
        }
        if (local_90._M_string_length == 0) goto LAB_00129308;
        if (iVar4 == 0) {
          pCVar7 = (CJSONException *)__cxa_allocate_exception(0x30);
          std::operator+(&local_50,"Missing seperator after \'",&local_90);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_c0._M_dataplus._M_p = (pointer)*plVar8;
          psVar10 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_c0._M_dataplus._M_p == psVar10) {
            local_c0.field_2._M_allocated_capacity = *psVar10;
            local_c0.field_2._8_8_ = plVar8[3];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *psVar10;
          }
          local_c0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          CJSONException::CJSONException(pCVar7,&local_c0,MISSING_SEPERATOR);
          __cxa_throw(pCVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        bVar3 = true;
        iVar4 = 0;
        cVar13 = (char)&local_c0;
        if (uVar9 == 0x5b) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          local_c0._M_string_length = 0;
          local_c0.field_2._M_allocated_capacity =
               (ulong)(uint7)local_c0.field_2._M_allocated_capacity._1_7_ << 8;
          do {
            std::__cxx11::string::push_back(cVar13);
            iVar11 = -(uint)(*local_a0 == 0x5d);
            if (*local_a0 == 0x5b) {
              iVar11 = 1;
            }
            iVar4 = iVar4 + iVar11;
          } while ((iVar4 != 0) && (local_a0 = local_a0 + 1, local_a0 != local_98));
        }
        else {
          if (uVar9 != 0x7b) goto LAB_0012924b;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          local_c0._M_string_length = 0;
          local_c0.field_2._M_allocated_capacity =
               (ulong)(uint7)local_c0.field_2._M_allocated_capacity._1_7_ << 8;
          iVar4 = 0;
          do {
            std::__cxx11::string::push_back(cVar13);
            iVar11 = -(uint)(*local_a0 == 0x7d);
            if (*local_a0 == 0x7b) {
              iVar11 = 1;
            }
            iVar4 = iVar4 + iVar11;
          } while ((iVar4 != 0) && (local_a0 = local_a0 + 1, local_a0 != local_98));
        }
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
LAB_00129248:
        bVar3 = true;
        iVar4 = 0;
      }
LAB_0012924b:
      if (bVar3) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->m_Values,&local_90);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        iVar4 = 0;
        local_90._M_string_length = 0;
        *local_90._M_dataplus._M_p = '\0';
        local_68 = 0;
        *local_70 = 0;
      }
      if (local_a0 != local_98) {
        local_a0 = local_a0 + 1;
      }
    } while (local_a0 != local_98);
  }
  if ((!bVar2) || (*local_a0 == 0x7d)) {
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
LAB_00129301:
  uVar12 = 2;
LAB_0012930d:
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
  *puVar6 = &PTR__CJSONException_00140d38;
  puVar6[1] = puVar6 + 3;
  puVar6[2] = 0;
  *(undefined1 *)(puVar6 + 3) = 0;
  *(undefined4 *)(puVar6 + 5) = uVar12;
  __cxa_throw(puVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
}

Assistant:

inline void ParseObject(const std::string &obj)
        {
            m_Values.clear();
            std::string Key, Value;
            bool ValAllowed = false;
            bool KeyValueValid = false;
            bool ValidObject = false;

            /*
                Why we use raw pointers instead of iterators or an for loop?
                Because I think its much faster to use pointer arithmetic instead
                of iterator arithmetic or for loops.

                If I'm wrong with my thoughts, please correct me.
             */
            const char *beg = obj.c_str();
            const char *end = beg + obj.size();

            while (beg != end && *beg != '}')
            {
                switch (*beg)
                {
                    // Parses a string.
                    case '\"':
                    {
                        // Throw an exception if we found a string outside of an object.
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
                        else if(KeyValueValid)
                            throw CJSONException("Missing seperator ','.", JSONErrorType::MISSING_SEPERATOR);

                        // Quick and dirty check if we need a key or a value.
                        if(Key.empty())
                            Key = ParseString(beg, end);
                        else if(Value.empty() && ValAllowed)
                        {
                            ValAllowed = false;
                            KeyValueValid = true;
                            Value = ParseString(beg, end);
                        }
                        else   // Throw an exception if we doesn't expected a key or value. That occurs always if a colon is missing.
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);                            
                    }break;

                    // Ignore all whitespace characters, which are outside of values.
                    case '\t':
                    case '\n':
                    case '\f':
                    case '\r':
                    case ' ':
                    {

                    }break;

                    // Parses an object or array.
                    case '{':
                    case '[':
                    {
                        // If this is the root object then set the validator flag.
                        if(!ValidObject)
                        {
                            ValidObject = true;
                            break;
                        }

                        // Throws an exception either if the key is missing or a value wasn't expected.
                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        // Objects and arrays are saved as strings and parsed later.
                        if(*beg == '{')
                            Value = ParseBracketStr('{', '}', beg, end);
                        else if(*beg == '[')
                            Value = ParseBracketStr('[', ']', beg, end);
                    }break;

                    // Allows the next key value pair.
                    case ',': 
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(!KeyValueValid)
                            throw CJSONException("Lonly ','", JSONErrorType::WRONG_PLACED_SEPERATOR);        

                        KeyValueValid = false;
                    }break;

                    // Allows a value.
                    case ':':
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY);

                        ValAllowed = true;
                    }break;

                    default:
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        switch (*beg)
                        {
                            // If a non escaped string begins with t or f it's maybe a boolean.
                            case 't':
                            case 'f':
                            {
                                Value = ParseBool(beg, end);
                            }break;

                            // If a non escaped string begins with n it's maybe a null object.
                            case 'n':
                            {
                                Value = ParseNull(beg, end);
                            }break;

                            default:
                            {
                                // If a non escaped string begins with a number, plus or minus it's maybe a number.
                                if(isalnum(*beg) || *beg == '-' || *beg == '+')
                                    Value = ParseNum(beg, end);
                                else    // Otherwise throw an exception.
                                    throw CJSONException("Invalid type for key '" + Key + "'", JSONErrorType::INVALID_TYPE);
                            }break;
                        }
                    }break;
                }

                // If key and value is set save it for later use.
                if(KeyValueValid)
                {
                    ValAllowed = false;
                    m_Values[Key] = Value;
                    Key.clear();
                    Value.clear();
                }

                if(beg != end)
                    beg++;
            }

            // Validates the object.
            if(ValidObject && *beg != '}')
                throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
        }